

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

int cuddZddSiftingAux(DdManager *table,int x,int x_low,int x_high)

{
  uint initial_size_00;
  DdNode *pDVar1;
  Move *pMVar2;
  int iVar3;
  int result;
  int initial_size;
  Move *moveDown;
  Move *moveUp;
  Move *move;
  int x_high_local;
  int x_low_local;
  int x_local;
  DdManager *table_local;
  
  initial_size_00 = table->keysZ;
  _result = (DdNode *)0x0;
  moveDown = (Move *)0x0;
  if (x == x_low) {
    _result = (DdNode *)cuddZddSiftingDown(table,x,x_high,initial_size_00);
    if (_result == (DdNode *)0x0) goto LAB_00a6c975;
    iVar3 = cuddZddSiftingBackward(table,(Move *)_result,initial_size_00);
  }
  else if (x == x_high) {
    moveDown = cuddZddSiftingUp(table,x,x_low,initial_size_00);
    if (moveDown == (Move *)0x0) goto LAB_00a6c975;
    iVar3 = cuddZddSiftingBackward(table,moveDown,initial_size_00);
  }
  else if (x_high - x < x - x_low) {
    _result = (DdNode *)cuddZddSiftingDown(table,x,x_high,initial_size_00);
    if ((_result == (DdNode *)0x0) ||
       (moveDown = cuddZddSiftingUp(table,_result->ref,x_low,initial_size_00),
       moveDown == (Move *)0x0)) goto LAB_00a6c975;
    iVar3 = cuddZddSiftingBackward(table,moveDown,initial_size_00);
  }
  else {
    moveDown = cuddZddSiftingUp(table,x,x_low,initial_size_00);
    if ((moveDown == (Move *)0x0) ||
       (_result = (DdNode *)cuddZddSiftingDown(table,moveDown->x,x_high,initial_size_00),
       _result == (DdNode *)0x0)) goto LAB_00a6c975;
    iVar3 = cuddZddSiftingBackward(table,(Move *)_result,initial_size_00);
  }
  if (iVar3 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar1 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = table->nextFree;
      table->nextFree = _result;
      _result = pDVar1;
    }
    while (moveDown != (Move *)0x0) {
      pMVar2 = moveDown->next;
      moveDown->y = 0;
      *(DdNode **)&moveDown->flags = table->nextFree;
      table->nextFree = (DdNode *)moveDown;
      moveDown = pMVar2;
    }
    return 1;
  }
LAB_00a6c975:
  while (_result != (DdNode *)0x0) {
    pDVar1 = (_result->type).kids.T;
    _result->ref = 0;
    _result->next = table->nextFree;
    table->nextFree = _result;
    _result = pDVar1;
  }
  while (moveDown != (Move *)0x0) {
    pMVar2 = moveDown->next;
    moveDown->y = 0;
    *(DdNode **)&moveDown->flags = table->nextFree;
    table->nextFree = (DdNode *)moveDown;
    moveDown = pMVar2;
  }
  return 0;
}

Assistant:

static int
cuddZddSiftingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high)
{
    Move        *move;
    Move        *moveUp;        /* list of up move */
    Move        *moveDown;      /* list of down move */

    int         initial_size;
    int         result;

    initial_size = table->keysZ;

#ifdef DD_DEBUG
    assert(table->subtableZ[x].keys > 0);
#endif

    moveDown = NULL;
    moveUp = NULL;

    if (x == x_low) {
        moveDown = cuddZddSiftingDown(table, x, x_high, initial_size);
        /* after that point x --> x_high */
        if (moveDown == NULL)
            goto cuddZddSiftingAuxOutOfMem;
        result = cuddZddSiftingBackward(table, moveDown,
            initial_size);
        /* move backward and stop at best position */
        if (!result)
            goto cuddZddSiftingAuxOutOfMem;

    }
    else if (x == x_high) {
        moveUp = cuddZddSiftingUp(table, x, x_low, initial_size);
        /* after that point x --> x_low */
        if (moveUp == NULL)
            goto cuddZddSiftingAuxOutOfMem;
        result = cuddZddSiftingBackward(table, moveUp, initial_size);
        /* move backward and stop at best position */
        if (!result)
            goto cuddZddSiftingAuxOutOfMem;
    }
    else if ((x - x_low) > (x_high - x)) {
        /* must go down first:shorter */
        moveDown = cuddZddSiftingDown(table, x, x_high, initial_size);
        /* after that point x --> x_high */
        if (moveDown == NULL)
            goto cuddZddSiftingAuxOutOfMem;
        moveUp = cuddZddSiftingUp(table, moveDown->y, x_low,
            initial_size);
        if (moveUp == NULL)
            goto cuddZddSiftingAuxOutOfMem;
        result = cuddZddSiftingBackward(table, moveUp, initial_size);
        /* move backward and stop at best position */
        if (!result)
            goto cuddZddSiftingAuxOutOfMem;
    }
    else {
        moveUp = cuddZddSiftingUp(table, x, x_low, initial_size);
        /* after that point x --> x_high */
        if (moveUp == NULL)
            goto cuddZddSiftingAuxOutOfMem;
        moveDown = cuddZddSiftingDown(table, moveUp->x, x_high,
            initial_size);
        /* then move up */
        if (moveDown == NULL)
            goto cuddZddSiftingAuxOutOfMem;
        result = cuddZddSiftingBackward(table, moveDown,
            initial_size);
        /* move backward and stop at best position */
        if (!result)
            goto cuddZddSiftingAuxOutOfMem;
    }

    while (moveDown != NULL) {
        move = moveDown->next;
        cuddDeallocMove(table, moveDown);
        moveDown = move;
    }
    while (moveUp != NULL) {
        move = moveUp->next;
        cuddDeallocMove(table, moveUp);
        moveUp = move;
    }

    return(1);

cuddZddSiftingAuxOutOfMem:
    while (moveDown != NULL) {
        move = moveDown->next;
        cuddDeallocMove(table, moveDown);
        moveDown = move;
    }
    while (moveUp != NULL) {
        move = moveUp->next;
        cuddDeallocMove(table, moveUp);
        moveUp = move;
    }

    return(0);

}